

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigpipe.h
# Opt level: O3

void sigpipe_ignore(Curl_easy *data,sigpipe_ignore *ig)

{
  sigaction action;
  _union_1457 local_a8 [19];
  
  ig->no_signal = (_Bool)((data->set).field_0x8be & 1);
  if (((data->set).field_0x8be & 1) == 0) {
    sigaction(0xd,(sigaction *)0x0,(sigaction *)ig);
    memcpy(local_a8,ig,0x98);
    local_a8[0] = (_union_1457)0x1;
    sigaction(0xd,(sigaction *)local_a8,(sigaction *)0x0);
  }
  return;
}

Assistant:

static void sigpipe_ignore(struct Curl_easy *data,
                           struct sigpipe_ignore *ig)
{
  /* get a local copy of no_signal because the Curl_easy might not be
     around when we restore */
  ig->no_signal = data->set.no_signal;
  if(!data->set.no_signal) {
    struct sigaction action;
    /* first, extract the existing situation */
    sigaction(SIGPIPE, NULL, &ig->old_pipe_act);
    action = ig->old_pipe_act;
    /* ignore this signal */
    action.sa_handler = SIG_IGN;
    sigaction(SIGPIPE, &action, NULL);
  }
}